

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O3

string * __thiscall
rcg::getString_abi_cxx11_
          (string *__return_storage_ptr__,rcg *this,shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,
          char *name,bool exception,bool igncache)

{
  long lVar1;
  double dVar2;
  char cVar3;
  int iVar4;
  undefined4 uVar5;
  uint uVar6;
  long *plVar7;
  ostream *poVar8;
  ostringstream *this_00;
  invalid_argument *piVar9;
  long *plVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint8_t buffer [32];
  ostringstream out;
  undefined1 auStack_228 [12];
  undefined4 local_21c;
  long *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  cVar3 = (char)name;
  this_00 = (ostringstream *)local_1a8;
  std::__cxx11::ostringstream::ostringstream(this_00);
  plVar7 = *(long **)this;
  GenICam_3_4::gcstring::gcstring((gcstring *)&local_218,(char *)nodemap);
  plVar7 = (long *)(**(code **)(*plVar7 + 0x38))(plVar7,&local_218);
  GenICam_3_4::gcstring::~gcstring((gcstring *)&local_218);
  if (plVar7 == (long *)0x0) {
    if (cVar3 != '\0') {
      piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_1c8[0] = local_1b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c8,"Feature not found: ","");
      plVar7 = (long *)std::__cxx11::string::append((char *)local_1c8);
      local_218 = (long *)*plVar7;
      plVar10 = plVar7 + 2;
      if (local_218 == plVar10) {
        local_208 = *plVar10;
        lStack_200 = plVar7[3];
        local_218 = &local_208;
      }
      else {
        local_208 = *plVar10;
      }
      local_210 = plVar7[1];
      *plVar7 = (long)plVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      local_21c = (undefined4)CONCAT71((int7)((ulong)plVar7 >> 8),1);
      std::invalid_argument::invalid_argument(piVar9,(string *)&local_218);
      local_21c = 0;
      __cxa_throw(piVar9,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    goto LAB_001203e7;
  }
  iVar4 = (*(code *)**(undefined8 **)((long)plVar7 + *(long *)(*plVar7 + -0x28)))
                    ((long)plVar7 + *(long *)(*plVar7 + -0x28));
  if (1 < iVar4 - 3U) {
    if (cVar3 != '\0') {
      piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_1c8[0] = local_1b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,"Feature not readable: ","");
      plVar7 = (long *)std::__cxx11::string::append((char *)local_1c8);
      local_218 = (long *)*plVar7;
      plVar10 = plVar7 + 2;
      if (local_218 == plVar10) {
        local_208 = *plVar10;
        lStack_200 = plVar7[3];
        local_218 = &local_208;
      }
      else {
        local_208 = *plVar10;
      }
      local_210 = plVar7[1];
      *plVar7 = (long)plVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      local_21c = (undefined4)CONCAT71((int7)((ulong)plVar7 >> 8),1);
      std::invalid_argument::invalid_argument(piVar9,(string *)&local_218);
      local_21c = 0;
      __cxa_throw(piVar9,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    goto LAB_001203e7;
  }
  uVar5 = (**(code **)(*plVar7 + 0xf0))(plVar7);
  switch(uVar5) {
  case 2:
    plVar7 = (long *)__dynamic_cast(plVar7,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IInteger::typeinfo,0xfffffffffffffffe);
    (**(code **)(*plVar7 + 0x48))(plVar7,0,exception);
    iVar4 = (**(code **)(*plVar7 + 0x88))(plVar7);
    if (iVar4 == 4) {
      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
    }
    else if (iVar4 == 5) {
      poVar8 = std::ostream::_M_insert<long>((long)local_1a8);
      local_218._0_1_ = (gcstring)0x2e;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_218,1);
      poVar8 = std::ostream::_M_insert<long>((long)poVar8);
      local_218._0_1_ = (gcstring)0x2e;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_218,1);
      poVar8 = std::ostream::_M_insert<long>((long)poVar8);
      local_218 = (long *)CONCAT71(local_218._1_7_,0x2e);
      this_00 = (ostringstream *)
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_218,1);
    }
    else if (iVar4 == 6) {
      *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
           *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
      lVar1 = *(long *)(local_1a8[0] + -0x18);
      if (acStack_c8[lVar1 + 1] == '\0') {
        std::ios::widen((char)auStack_228 + (char)lVar1 + -0x80);
        acStack_c8[lVar1 + 1] = '\x01';
      }
      acStack_c8[lVar1] = '0';
      *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 2;
      poVar8 = std::ostream::_M_insert<long>((long)local_1a8);
      local_218._0_1_ = (gcstring)0x3a;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_218,1);
      *(undefined8 *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x10) = 2;
      poVar8 = std::ostream::_M_insert<long>((long)poVar8);
      local_218._0_1_ = (gcstring)0x3a;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_218,1);
      *(undefined8 *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x10) = 2;
      poVar8 = std::ostream::_M_insert<long>((long)poVar8);
      local_218._0_1_ = (gcstring)0x3a;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_218,1);
      *(undefined8 *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x10) = 2;
      poVar8 = std::ostream::_M_insert<long>((long)poVar8);
      local_218._0_1_ = (gcstring)0x3a;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_218,1);
      *(undefined8 *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x10) = 2;
      poVar8 = std::ostream::_M_insert<long>((long)poVar8);
      local_218 = (long *)CONCAT71(local_218._1_7_,0x3a);
      this_00 = (ostringstream *)
                std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_218,1);
      *(undefined8 *)((ostream *)this_00 + *(long *)(*(long *)this_00 + -0x18) + 0x10) = 2;
    }
    std::ostream::_M_insert<long>((long)this_00);
    break;
  case 3:
    plVar7 = (long *)__dynamic_cast(plVar7,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IBoolean::typeinfo,0xfffffffffffffffe);
    (**(code **)(*plVar7 + 0x48))(plVar7,0,exception);
    std::ostream::_M_insert<bool>(SUB81(local_1a8,0));
    break;
  default:
    if (cVar3 != '\0') {
      piVar9 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_1c8[0] = local_1b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,"Feature of unknown datatype: ","");
      plVar7 = (long *)std::__cxx11::string::append((char *)local_1c8);
      local_218 = (long *)*plVar7;
      plVar10 = plVar7 + 2;
      if (local_218 == plVar10) {
        local_208 = *plVar10;
        lStack_200 = plVar7[3];
        local_218 = &local_208;
      }
      else {
        local_208 = *plVar10;
      }
      local_210 = plVar7[1];
      *plVar7 = (long)plVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      local_21c = (undefined4)CONCAT71((int7)((ulong)plVar7 >> 8),1);
      std::invalid_argument::invalid_argument(piVar9,(string *)&local_218);
      local_21c = 0;
      __cxa_throw(piVar9,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    break;
  case 5:
    plVar7 = (long *)__dynamic_cast(plVar7,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IFloat::typeinfo,0xfffffffffffffffe);
    dVar2 = (double)(**(code **)(*plVar7 + 0x48))(plVar7,0,exception);
    std::ostream::_M_insert<double>(dVar2);
    break;
  case 6:
    plVar7 = (long *)__dynamic_cast(plVar7,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IString::typeinfo,0xfffffffffffffffe);
    (**(code **)(*plVar7 + 0x48))(&local_218,plVar7,0,exception);
    operator<<((ostream *)local_1a8,(gcstring *)&local_218);
    goto LAB_0012022e;
  case 7:
    plVar7 = (long *)__dynamic_cast(plVar7,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IRegister::typeinfo,0xfffffffffffffffe);
    uVar6 = (**(code **)(*plVar7 + 0x48))(plVar7,0);
    uVar12 = 0x20;
    if ((int)uVar6 < 0x20) {
      uVar12 = uVar6;
    }
    (**(code **)(*plVar7 + 0x40))(plVar7,&local_218,(long)(int)uVar12,0,0);
    *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
         *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
    if (0 < (int)uVar6) {
      uVar11 = 1;
      if (1 < (int)uVar12) {
        uVar11 = (ulong)uVar12;
      }
      uVar13 = 0;
      do {
        lVar1 = *(long *)(local_1a8[0] + -0x18);
        if (acStack_c8[lVar1 + 1] == '\0') {
          std::ios::widen((char)auStack_228 + (char)lVar1 + -0x80);
          acStack_c8[lVar1 + 1] = '\x01';
        }
        acStack_c8[lVar1] = '0';
        *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 2;
        std::ostream::operator<<((ostream *)local_1a8,(uint)*(byte *)((long)&local_218 + uVar13));
        uVar13 = uVar13 + 1;
      } while (uVar11 != uVar13);
    }
    break;
  case 9:
    plVar7 = (long *)__dynamic_cast(plVar7,&GenApi_3_4::INode::typeinfo,
                                    &GenApi_3_4::IEnumeration::typeinfo,0xfffffffffffffffe);
    plVar7 = (long *)(**(code **)(*plVar7 + 0x78))(plVar7,0,0);
    (**(code **)(*plVar7 + 0x40))(&local_218,plVar7);
    operator<<((ostream *)local_1a8,(gcstring *)&local_218);
LAB_0012022e:
    GenICam_3_4::gcstring::~gcstring((gcstring *)&local_218);
  }
LAB_001203e7:
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string getString(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
                      bool exception, bool igncache)
{
  std::ostringstream out;

  try
  {
    GenApi::INode *node=nodemap->_GetNode(name);

    if (node != 0)
    {
      if (GenApi::IsReadable(node))
      {
        switch (node->GetPrincipalInterfaceType())
        {
          case GenApi::intfIBoolean:
            {
              GenApi::IBoolean *p=dynamic_cast<GenApi::IBoolean *>(node);
              out << p->GetValue(false, igncache);
            }
            break;

          case GenApi::intfIInteger:
            {
              GenApi::IInteger *p=dynamic_cast<GenApi::IInteger *>(node);
              int64_t value=p->GetValue(false, igncache);

              switch (p->GetRepresentation())
              {
                case GenApi::HexNumber:
                  out << std::hex << value;
                  break;

                case GenApi::IPV4Address:
                   out << ((value>>24)&0xff) << '.' << ((value>>16)&0xff) << '.'
                       << ((value>>8)&0xff) << '.' << (value&0xff);
                   break;

                case GenApi::MACAddress:
                   out << std::hex << std::setfill('0');
                   out << std::setw(2) << ((value>>40)&0xff) << ':'
                       << std::setw(2) << ((value>>32)&0xff) << ':'
                       << std::setw(2) << ((value>>24)&0xff) << ':'
                       << std::setw(2) << ((value>>16)&0xff) << ':'
                       << std::setw(2) << ((value>>8)&0xff) << ':'
                       << std::setw(2) << (value&0xff);
                   break;

                default:
                  out << value;
                  break;
              }
            }
            break;

          case GenApi::intfIFloat:
            {
              GenApi::IFloat *p=dynamic_cast<GenApi::IFloat *>(node);
              out << p->GetValue(false, igncache);
            }
            break;

          case GenApi::intfIEnumeration:
            {
              GenApi::IEnumeration *p=dynamic_cast<GenApi::IEnumeration *>(node);
              out << p->GetCurrentEntry()->GetSymbolic();
            }
            break;

          case GenApi::intfIRegister:
            {
              GenApi::IRegister *p=dynamic_cast<GenApi::IRegister *>(node);

              int len=std::min(static_cast<int>(p->GetLength()), 32);

              uint8_t buffer[32];
              p->Get(buffer, len);

              out << std::hex;
              for (int i=0; i<len; i++)
              {
                out << std::setfill('0') << std::setw(2) << static_cast<int>(buffer[i]);
              }
            }
            break;

          case GenApi::intfIString:
            {
              GenApi::IString *p=dynamic_cast<GenApi::IString *>(node);
              out << p->GetValue(false, igncache);
            }
            break;

          default:
            if (exception)
            {
              throw std::invalid_argument(std::string("Feature of unknown datatype: ")+name);
            }
            break;
        }
      }
      else if (exception)
      {
        throw std::invalid_argument(std::string("Feature not readable: ")+name);
      }
    }
    else if (exception)
    {
      throw std::invalid_argument(std::string("Feature not found: ")+name);
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return out.str();
}